

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLright(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *vec)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  fpclass_type fVar4;
  fpclass_type fVar5;
  pointer pnVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  int32_t iVar10;
  int32_t iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  int iVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  cpp_dec_float<200U,_int,_void> *pcVar18;
  cpp_dec_float<200U,_int,_void> *pcVar19;
  uint *puVar20;
  cpp_dec_float<200U,_int,_void> *pcVar21;
  cpp_dec_float<200U,_int,_void> *pcVar22;
  uint *puVar23;
  int *piVar24;
  byte bVar25;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_248;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1c8;
  ulong local_1c0;
  cpp_dec_float<200U,_int,_void> local_1b8;
  cpp_dec_float<200U,_int,_void> local_138;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar25 = 0;
  local_138.fpclass = cpp_dec_float_finite;
  local_138.prec_elem = 0x1c;
  local_138.data._M_elems[0] = 0;
  local_138.data._M_elems[1] = 0;
  local_138.data._M_elems[2] = 0;
  local_138.data._M_elems[3] = 0;
  local_138.data._M_elems[4] = 0;
  local_138.data._M_elems[5] = 0;
  local_138.data._M_elems[6] = 0;
  local_138.data._M_elems[7] = 0;
  local_138.data._M_elems[8] = 0;
  local_138.data._M_elems[9] = 0;
  local_138.data._M_elems[10] = 0;
  local_138.data._M_elems[0xb] = 0;
  local_138.data._M_elems[0xc] = 0;
  local_138.data._M_elems[0xd] = 0;
  local_138.data._M_elems[0xe] = 0;
  local_138.data._M_elems[0xf] = 0;
  local_138.data._M_elems[0x10] = 0;
  local_138.data._M_elems[0x11] = 0;
  local_138.data._M_elems[0x12] = 0;
  local_138.data._M_elems[0x13] = 0;
  local_138.data._M_elems[0x14] = 0;
  local_138.data._M_elems[0x15] = 0;
  local_138.data._M_elems[0x16] = 0;
  local_138.data._M_elems[0x17] = 0;
  local_138.data._M_elems[0x18] = 0;
  local_138.data._M_elems[0x19] = 0;
  local_138.data._M_elems._104_5_ = 0;
  local_138.data._M_elems[0x1b]._1_3_ = 0;
  local_138.exp = 0;
  local_138.neg = false;
  pnVar6 = (this->l).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar7 = (this->l).idx;
  piVar8 = (this->l).row;
  piVar9 = (this->l).start;
  local_1c0 = (ulong)(this->l).firstUpdate;
  if ((long)local_1c0 < 1) {
    uVar13 = 0;
  }
  else {
    local_1c8 = this;
    uVar13 = 0;
    do {
      iVar12 = piVar8[uVar13];
      pnVar17 = vec + iVar12;
      pcVar15 = &local_138;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pcVar15->data)._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
        pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar17 + ((ulong)bVar25 * -2 + 1) * 4);
        pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar25 * -8 + 4);
      }
      local_138.exp = vec[iVar12].m_backend.exp;
      local_138.neg = vec[iVar12].m_backend.neg;
      fVar4 = vec[iVar12].m_backend.fpclass;
      iVar10 = vec[iVar12].m_backend.prec_elem;
      local_138.fpclass = fVar4;
      local_138.prec_elem = iVar10;
      if (fVar4 == cpp_dec_float_NaN) {
LAB_0053b74b:
        iVar12 = piVar9[uVar13];
        iVar16 = piVar9[uVar13 + 1];
        if (iVar12 < iVar16) {
          pcVar15 = &pnVar6[iVar12].m_backend;
          piVar24 = piVar7 + iVar12;
          do {
            local_248.fpclass = cpp_dec_float_finite;
            local_248.prec_elem = 0x1c;
            local_248.data._M_elems[0] = 0;
            local_248.data._M_elems[1] = 0;
            local_248.data._M_elems[2] = 0;
            local_248.data._M_elems[3] = 0;
            local_248.data._M_elems[4] = 0;
            local_248.data._M_elems[5] = 0;
            local_248.data._M_elems[6] = 0;
            local_248.data._M_elems[7] = 0;
            local_248.data._M_elems[8] = 0;
            local_248.data._M_elems[9] = 0;
            local_248.data._M_elems[10] = 0;
            local_248.data._M_elems[0xb] = 0;
            local_248.data._M_elems[0xc] = 0;
            local_248.data._M_elems[0xd] = 0;
            local_248.data._M_elems[0xe] = 0;
            local_248.data._M_elems[0xf] = 0;
            local_248.data._M_elems[0x10] = 0;
            local_248.data._M_elems[0x11] = 0;
            local_248.data._M_elems[0x12] = 0;
            local_248.data._M_elems[0x13] = 0;
            local_248.data._M_elems[0x14] = 0;
            local_248.data._M_elems[0x15] = 0;
            local_248.data._M_elems[0x16] = 0;
            local_248.data._M_elems[0x17] = 0;
            local_248.data._M_elems[0x18] = 0;
            local_248.data._M_elems[0x19] = 0;
            local_248.data._M_elems._104_5_ = 0;
            local_248.data._M_elems[0x1b]._1_3_ = 0;
            local_248.exp = 0;
            local_248.neg = false;
            pcVar18 = &local_138;
            if (pcVar15 != &local_248) {
              pcVar21 = &local_248;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                (pcVar21->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
                pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar25 * -8 + 4)
                ;
                pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar25 * -8 + 4)
                ;
              }
              local_248.exp = local_138.exp;
              local_248.neg = local_138.neg;
              local_248.fpclass = local_138.fpclass;
              local_248.prec_elem = local_138.prec_elem;
              pcVar18 = pcVar15;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      (&local_248,pcVar18);
            iVar1 = *piVar24;
            local_b8.fpclass = cpp_dec_float_finite;
            local_b8.prec_elem = 0x1c;
            local_b8.data._M_elems[0] = 0;
            local_b8.data._M_elems[1] = 0;
            local_b8.data._M_elems[2] = 0;
            local_b8.data._M_elems[3] = 0;
            local_b8.data._M_elems[4] = 0;
            local_b8.data._M_elems[5] = 0;
            local_b8.data._M_elems[6] = 0;
            local_b8.data._M_elems[7] = 0;
            local_b8.data._M_elems[8] = 0;
            local_b8.data._M_elems[9] = 0;
            local_b8.data._M_elems[10] = 0;
            local_b8.data._M_elems[0xb] = 0;
            local_b8.data._M_elems[0xc] = 0;
            local_b8.data._M_elems[0xd] = 0;
            local_b8.data._M_elems[0xe] = 0;
            local_b8.data._M_elems[0xf] = 0;
            local_b8.data._M_elems[0x10] = 0;
            local_b8.data._M_elems[0x11] = 0;
            local_b8.data._M_elems[0x12] = 0;
            local_b8.data._M_elems[0x13] = 0;
            local_b8.data._M_elems[0x14] = 0;
            local_b8.data._M_elems[0x15] = 0;
            local_b8.data._M_elems[0x16] = 0;
            local_b8.data._M_elems[0x17] = 0;
            local_b8.data._M_elems[0x18] = 0;
            local_b8.data._M_elems[0x19] = 0;
            local_b8.data._M_elems._104_5_ = 0;
            local_b8.data._M_elems[0x1b]._1_3_ = 0;
            local_b8.exp = 0;
            local_b8.neg = false;
            pcVar18 = &local_138;
            if (pcVar15 != &local_b8) {
              pcVar21 = &local_b8;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                (pcVar21->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
                pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar25 * -8 + 4)
                ;
                pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar25 * -8 + 4)
                ;
              }
              local_b8.exp = local_138.exp;
              local_b8.neg = local_138.neg;
              local_b8.fpclass = local_138.fpclass;
              local_b8.prec_elem = local_138.prec_elem;
              pcVar18 = pcVar15;
            }
            pcVar21 = &vec[iVar1].m_backend;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      (&local_b8,pcVar18);
            local_1b8.fpclass = cpp_dec_float_finite;
            local_1b8.prec_elem = 0x1c;
            local_1b8.data._M_elems[0] = 0;
            local_1b8.data._M_elems[1] = 0;
            local_1b8.data._M_elems[2] = 0;
            local_1b8.data._M_elems[3] = 0;
            local_1b8.data._M_elems[4] = 0;
            local_1b8.data._M_elems[5] = 0;
            local_1b8.data._M_elems[6] = 0;
            local_1b8.data._M_elems[7] = 0;
            local_1b8.data._M_elems[8] = 0;
            local_1b8.data._M_elems[9] = 0;
            local_1b8.data._M_elems[10] = 0;
            local_1b8.data._M_elems[0xb] = 0;
            local_1b8.data._M_elems[0xc] = 0;
            local_1b8.data._M_elems[0xd] = 0;
            local_1b8.data._M_elems[0xe] = 0;
            local_1b8.data._M_elems[0xf] = 0;
            local_1b8.data._M_elems[0x10] = 0;
            local_1b8.data._M_elems[0x11] = 0;
            local_1b8.data._M_elems[0x12] = 0;
            local_1b8.data._M_elems[0x13] = 0;
            local_1b8.data._M_elems[0x14] = 0;
            local_1b8.data._M_elems[0x15] = 0;
            local_1b8.data._M_elems[0x16] = 0;
            local_1b8.data._M_elems[0x17] = 0;
            local_1b8.data._M_elems[0x18] = 0;
            local_1b8.data._M_elems[0x19] = 0;
            local_1b8.data._M_elems._104_5_ = 0;
            local_1b8.data._M_elems[0x1b]._1_3_ = 0;
            local_1b8.exp = 0;
            local_1b8.neg = false;
            if (&local_1b8 != pcVar21) {
              pcVar18 = pcVar21;
              pcVar19 = &local_1b8;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                (pcVar19->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
                pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar25 * -8 + 4)
                ;
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar25 * -8 + 4)
                ;
              }
              local_1b8.exp = pcVar21->exp;
              local_1b8.neg = pcVar21->neg;
              local_1b8.fpclass = pcVar21->fpclass;
              local_1b8.prec_elem = pcVar21->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_1b8,&local_b8);
            local_248.fpclass = cpp_dec_float_finite;
            local_248.prec_elem = 0x1c;
            local_248.data._M_elems[0] = 0;
            local_248.data._M_elems[1] = 0;
            local_248.data._M_elems[2] = 0;
            local_248.data._M_elems[3] = 0;
            local_248.data._M_elems[4] = 0;
            local_248.data._M_elems[5] = 0;
            local_248.data._M_elems[6] = 0;
            local_248.data._M_elems[7] = 0;
            local_248.data._M_elems[8] = 0;
            local_248.data._M_elems[9] = 0;
            local_248.data._M_elems[10] = 0;
            local_248.data._M_elems[0xb] = 0;
            local_248.data._M_elems[0xc] = 0;
            local_248.data._M_elems[0xd] = 0;
            local_248.data._M_elems[0xe] = 0;
            local_248.data._M_elems[0xf] = 0;
            local_248.data._M_elems[0x10] = 0;
            local_248.data._M_elems[0x11] = 0;
            local_248.data._M_elems[0x12] = 0;
            local_248.data._M_elems[0x13] = 0;
            local_248.data._M_elems[0x14] = 0;
            local_248.data._M_elems[0x15] = 0;
            local_248.data._M_elems[0x16] = 0;
            local_248.data._M_elems[0x17] = 0;
            local_248.data._M_elems[0x18] = 0;
            local_248.data._M_elems[0x19] = 0;
            local_248.data._M_elems._104_5_ = 0;
            local_248.data._M_elems[0x1b]._1_3_ = 0;
            local_248.exp = 0;
            local_248.neg = false;
            pcVar18 = &local_138;
            if (pcVar15 != &local_248) {
              pcVar21 = &local_248;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                (pcVar21->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
                pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar25 * -8 + 4)
                ;
                pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar25 * -8 + 4)
                ;
              }
              local_248.exp = local_138.exp;
              local_248.neg = local_138.neg;
              local_248.fpclass = local_138.fpclass;
              local_248.prec_elem = local_138.prec_elem;
              pcVar18 = pcVar15;
            }
            pcVar15 = pcVar15 + 1;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      (&local_248,pcVar18);
            iVar1 = *piVar24;
            piVar24 = piVar24 + 1;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&vec[iVar1].m_backend,&local_248);
            iVar16 = iVar16 + -1;
          } while (iVar12 < iVar16);
        }
      }
      else {
        local_248.fpclass = cpp_dec_float_finite;
        local_248.prec_elem = 0x1c;
        local_248.data._M_elems[0] = 0;
        local_248.data._M_elems[1] = 0;
        local_248.data._M_elems[2] = 0;
        local_248.data._M_elems[3] = 0;
        local_248.data._M_elems[4] = 0;
        local_248.data._M_elems[5] = 0;
        local_248.data._M_elems[6] = 0;
        local_248.data._M_elems[7] = 0;
        local_248.data._M_elems[8] = 0;
        local_248.data._M_elems[9] = 0;
        local_248.data._M_elems[10] = 0;
        local_248.data._M_elems[0xb] = 0;
        local_248.data._M_elems[0xc] = 0;
        local_248.data._M_elems[0xd] = 0;
        local_248.data._M_elems[0xe] = 0;
        local_248.data._M_elems[0xf] = 0;
        local_248.data._M_elems[0x10] = 0;
        local_248.data._M_elems[0x11] = 0;
        local_248.data._M_elems[0x12] = 0;
        local_248.data._M_elems[0x13] = 0;
        local_248.data._M_elems[0x14] = 0;
        local_248.data._M_elems[0x15] = 0;
        local_248.data._M_elems[0x16] = 0;
        local_248.data._M_elems[0x17] = 0;
        local_248.data._M_elems[0x18] = 0;
        local_248.data._M_elems[0x19] = 0;
        local_248.data._M_elems._104_5_ = 0;
        local_248.data._M_elems[0x1b]._1_3_ = 0;
        local_248.exp = 0;
        local_248.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_248,0.0);
        iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_138,&local_248);
        if (iVar12 != 0) goto LAB_0053b74b;
      }
      uVar13 = uVar13 + 1;
      this = local_1c8;
    } while (uVar13 != local_1c0);
  }
  if (((this->l).updateType != 0) && (uVar2 = (this->l).firstUnused, (int)uVar13 < (int)uVar2)) {
    uVar13 = uVar13 & 0xffffffff;
    do {
      iVar12 = piVar9[uVar13];
      pnVar17 = vec + piVar8[uVar13];
      uVar3 = (pnVar17->m_backend).data._M_elems[0];
      puVar20 = (pnVar17->m_backend).data._M_elems + 1;
      puVar23 = local_248.data._M_elems + 1;
      for (lVar14 = 0x1b; lVar14 != 0; lVar14 = lVar14 + -1) {
        *puVar23 = *puVar20;
        puVar20 = puVar20 + (ulong)bVar25 * -2 + 1;
        puVar23 = puVar23 + (ulong)bVar25 * -2 + 1;
      }
      local_248.data._M_elems[0] = uVar3;
      local_248.exp = (pnVar17->m_backend).exp;
      fVar5 = (pnVar17->m_backend).fpclass;
      iVar11 = (pnVar17->m_backend).prec_elem;
      local_248.neg =
           (bool)((uVar3 != 0 || fVar5 != cpp_dec_float_finite) ^ (pnVar17->m_backend).neg);
      local_248.fpclass = fVar5;
      local_248.prec_elem = iVar11;
      iVar16 = piVar9[uVar13 + 1];
      if (iVar12 < iVar16) {
        pcVar15 = &pnVar6[iVar12].m_backend;
        piVar24 = piVar7 + iVar12;
        do {
          pcVar21 = &vec[*piVar24].m_backend;
          local_1b8.fpclass = cpp_dec_float_finite;
          local_1b8.prec_elem = 0x1c;
          local_1b8.data._M_elems[0] = 0;
          local_1b8.data._M_elems[1] = 0;
          local_1b8.data._M_elems[2] = 0;
          local_1b8.data._M_elems[3] = 0;
          local_1b8.data._M_elems[4] = 0;
          local_1b8.data._M_elems[5] = 0;
          local_1b8.data._M_elems[6] = 0;
          local_1b8.data._M_elems[7] = 0;
          local_1b8.data._M_elems[8] = 0;
          local_1b8.data._M_elems[9] = 0;
          local_1b8.data._M_elems[10] = 0;
          local_1b8.data._M_elems[0xb] = 0;
          local_1b8.data._M_elems[0xc] = 0;
          local_1b8.data._M_elems[0xd] = 0;
          local_1b8.data._M_elems[0xe] = 0;
          local_1b8.data._M_elems[0xf] = 0;
          local_1b8.data._M_elems[0x10] = 0;
          local_1b8.data._M_elems[0x11] = 0;
          local_1b8.data._M_elems[0x12] = 0;
          local_1b8.data._M_elems[0x13] = 0;
          local_1b8.data._M_elems[0x14] = 0;
          local_1b8.data._M_elems[0x15] = 0;
          local_1b8.data._M_elems[0x16] = 0;
          local_1b8.data._M_elems[0x17] = 0;
          local_1b8.data._M_elems[0x18] = 0;
          local_1b8.data._M_elems[0x19] = 0;
          local_1b8.data._M_elems._104_5_ = 0;
          local_1b8.data._M_elems[0x1b]._1_3_ = 0;
          local_1b8.exp = 0;
          local_1b8.neg = false;
          pcVar18 = pcVar21;
          if ((pcVar15 != &local_1b8) && (pcVar18 = pcVar15, &local_1b8 != pcVar21)) {
            pcVar19 = pcVar21;
            pcVar22 = &local_1b8;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              (pcVar22->data)._M_elems[0] = (pcVar19->data)._M_elems[0];
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar25 * -8 + 4);
              pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar25 * -8 + 4);
            }
            local_1b8.exp = pcVar21->exp;
            local_1b8.neg = pcVar21->neg;
            local_1b8.fpclass = pcVar21->fpclass;
            local_1b8.prec_elem = pcVar21->prec_elem;
          }
          piVar24 = piVar24 + 1;
          pcVar15 = pcVar15 + 1;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_1b8,pcVar18);
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (&local_248,&local_1b8);
          iVar16 = iVar16 + -1;
        } while (iVar12 < iVar16);
      }
      piVar24 = piVar8 + uVar13;
      uVar13 = uVar13 + 1;
      pnVar17 = vec + *piVar24;
      (pnVar17->m_backend).data._M_elems[0] = local_248.data._M_elems[0];
      puVar20 = local_248.data._M_elems + 1;
      puVar23 = (pnVar17->m_backend).data._M_elems + 1;
      for (lVar14 = 0x1b; lVar14 != 0; lVar14 = lVar14 + -1) {
        *puVar23 = *puVar20;
        puVar20 = puVar20 + (ulong)bVar25 * -2 + 1;
        puVar23 = puVar23 + (ulong)bVar25 * -2 + 1;
      }
      (pnVar17->m_backend).exp = local_248.exp;
      (pnVar17->m_backend).neg =
           (bool)((local_248.data._M_elems[0] != 0 || local_248.fpclass != cpp_dec_float_finite) ^
                 local_248.neg);
      (pnVar17->m_backend).fpclass = local_248.fpclass;
      (pnVar17->m_backend).prec_elem = local_248.prec_elem;
    } while (uVar13 != uVar2);
  }
  return;
}

Assistant:

void CLUFactor<R>::solveLright(R* vec)
{
   int i, j, k;
   int end;
   R x;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   for(i = 0; i < end; ++i)
   {
      if((x = vec[lrow[i]]) != 0.0)
      {
         SPxOut::debug(this, "y{}={}\n", lrow[i], vec[lrow[i]]);

         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            SPxOut::debug(this, "                         -> y{} -= {} * {} = {}    -> {}\n", *idx, x, *val,
                          x * (*val), vec[*idx] - x * (*val));
            vec[*idx++] -= x * (*val++);
         }
      }
   }

   if(l.updateType)                      /* Forest-Tomlin Updates */
   {
      SPxOut::debug(this, "performing FT updates...\n");

      end = l.firstUnused;

      for(; i < end; ++i)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);
         StableSum<R> tmp(-vec[lrow[i]]);

         for(j = lbeg[i + 1]; j > k; --j)
            tmp += vec[*idx++] * (*val++);

         vec[lrow[i]] = -R(tmp);

         SPxOut::debug(this, "y{}={}\n", lrow[i], vec[lrow[i]]);
      }

      SPxOut::debug(this, "finished FT updates.\n");
   }
}